

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall
FascodeUtil::msg::print
          (msg *this,MSG_TYPE msgtype,string *appname,string *character,string *label,
          COLOR_TYPE color,int numberspace,string message)

{
  string *appname_00;
  string *message_00;
  string *character_00;
  string *label_00;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (msgtype == ERR) {
    std::__cxx11::string::string((string *)&local_50,(string *)appname);
    character_00 = &local_70;
    std::__cxx11::string::string((string *)character_00,(string *)character);
    label_00 = &local_90;
    std::__cxx11::string::string((string *)label_00,(string *)label);
    message_00 = &local_b0;
    std::__cxx11::string::string((string *)message_00,(string *)message._M_dataplus._M_p);
    appname_00 = &local_50;
    _print(this,(ostream *)&std::cerr,appname_00,character_00,label_00,color,numberspace,message_00)
    ;
  }
  else {
    std::__cxx11::string::string((string *)&local_d0,(string *)appname);
    character_00 = &local_f0;
    std::__cxx11::string::string((string *)character_00,(string *)character);
    label_00 = &local_110;
    std::__cxx11::string::string((string *)label_00,(string *)label);
    message_00 = &local_130;
    std::__cxx11::string::string((string *)message_00,(string *)message._M_dataplus._M_p);
    appname_00 = &local_d0;
    _print(this,(ostream *)&std::cout,appname_00,character_00,label_00,color,numberspace,message_00)
    ;
  }
  std::__cxx11::string::~string((string *)message_00);
  std::__cxx11::string::~string((string *)label_00);
  std::__cxx11::string::~string((string *)character_00);
  std::__cxx11::string::~string((string *)appname_00);
  return;
}

Assistant:

void msg::print(MSG_TYPE msgtype,std::string appname,std::string character,std::string label,COLOR_TYPE color,int numberspace,std::string message){
        if(msgtype == ERR){
            _print(std::cerr,appname,character,label,color,numberspace,message);
        }else{
            _print(std::cout,appname,character,label,color,numberspace,message);
        }
    }